

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddBranch(InstructionBuilder *this,uint32_t label_id)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  Instruction *pIVar1;
  IRContext *c;
  Operand *local_c0;
  allocator<spvtools::opt::Operand> local_b5;
  uint32_t local_b4;
  iterator local_b0;
  undefined8 local_a8;
  SmallVector<unsigned_int,_2UL> local_a0;
  Operand local_78;
  iterator local_48;
  _func_int **local_40;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_38;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_20;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  new_branch;
  uint32_t label_id_local;
  InstructionBuilder *this_local;
  
  new_branch._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = label_id;
  pIVar1 = (Instruction *)::operator_new(0x70);
  c = GetContext(this);
  local_b4 = new_branch._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  local_b0 = &local_b4;
  local_a8 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_b0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a0,init_list);
  Operand::Operand(&local_78,SPV_OPERAND_TYPE_ID,&local_a0);
  local_48 = &local_78;
  local_40 = (_func_int **)0x1;
  std::allocator<spvtools::opt::Operand>::allocator(&local_b5);
  __l._M_len = (size_type)local_40;
  __l._M_array = local_48;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&local_38,__l,&local_b5);
  opt::Instruction::Instruction(pIVar1,c,OpBranch,0,0,&local_38);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_20,pIVar1);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_38);
  std::allocator<spvtools::opt::Operand>::~allocator(&local_b5);
  local_c0 = (Operand *)&local_48;
  do {
    local_c0 = local_c0 + -1;
    Operand::~Operand(local_c0);
  } while (local_c0 != &local_78);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a0);
  pIVar1 = AddInstruction(this,&local_20);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_20);
  return pIVar1;
}

Assistant:

Instruction* AddBranch(uint32_t label_id) {
    std::unique_ptr<Instruction> new_branch(new Instruction(
        GetContext(), spv::Op::OpBranch, 0, 0,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {label_id}}}));
    return AddInstruction(std::move(new_branch));
  }